

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O1

void * glfwGetJoystickUserPointer(int jid)

{
  void *pvVar1;
  
  if (_glfw.initialized == 0) {
    pvVar1 = (void *)0x0;
    _glfwInputError(0x10001,(char *)0x0);
  }
  else if (_glfw.joysticks[jid].allocated == 0) {
    pvVar1 = (void *)0x0;
  }
  else {
    pvVar1 = _glfw.joysticks[jid].userPointer;
  }
  return pvVar1;
}

Assistant:

GLFWAPI void* glfwGetJoystickUserPointer(int jid)
{
    _GLFWjoystick* js;

    assert(jid >= GLFW_JOYSTICK_1);
    assert(jid <= GLFW_JOYSTICK_LAST);

    _GLFW_REQUIRE_INIT_OR_RETURN(NULL);

    js = _glfw.joysticks + jid;
    if (!js->allocated)
        return NULL;

    return js->userPointer;
}